

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::GetNormalHeapBlockAllocatorInfoForNativeAllocation
          (Recycler *this,size_t allocSize,void **allocatorAddress,uint32 *endAddressOffset,
          uint32 *freeListOffset,bool allowBumpAllocation,bool isOOPJIT)

{
  uint32 uVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  char *pcVar6;
  TBlockAllocatorType *pTVar7;
  undefined8 *in_FS_OFFSET;
  
  if (allocSize == 0 || (allocSize & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x59a,"(HeapInfo::IsAlignedSize(allocSize))",
                       "HeapInfo::IsAlignedSize(allocSize)");
    if (!bVar4) goto LAB_00268891;
    *puVar2 = 0;
  }
  if (0x300 < allocSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x59b,"(HeapInfo::IsSmallObject(allocSize))",
                       "HeapInfo::IsSmallObject(allocSize)");
    if (!bVar4) goto LAB_00268891;
    *puVar2 = 0;
  }
  pTVar7 = &(this->autoHeap).defaultHeap.heapBuckets[(int)(allocSize >> 4) - 1].heapBucket.
            super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
            .super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>.
            allocatorHead;
  *allocatorAddress = pTVar7;
  *endAddressOffset = 0;
  *freeListOffset = 8;
  if (!isOOPJIT) {
    pcVar6 = GetAddressOfAllocator<(Memory::ObjectInfoBits)0>(this,allocSize);
    if (pTVar7 != (TBlockAllocatorType *)pcVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5a9,"(allocatorAddress == GetAddressOfAllocator<NoBit>(allocSize))",
                         "allocatorAddress == GetAddressOfAllocator<NoBit>(allocSize)");
      if (!bVar4) goto LAB_00268891;
      *puVar2 = 0;
    }
    uVar1 = *endAddressOffset;
    uVar5 = GetEndAddressOffset<(Memory::ObjectInfoBits)0>(this,allocSize);
    if (uVar1 != uVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5aa,"(endAddressOffset == GetEndAddressOffset<NoBit>(allocSize))",
                         "endAddressOffset == GetEndAddressOffset<NoBit>(allocSize)");
      if (!bVar4) goto LAB_00268891;
      *puVar2 = 0;
    }
    uVar1 = *freeListOffset;
    uVar5 = GetFreeObjectListOffset<(Memory::ObjectInfoBits)0>(this,allocSize);
    if (uVar1 != uVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5ab,"(freeListOffset == GetFreeObjectListOffset<NoBit>(allocSize))",
                         "freeListOffset == GetFreeObjectListOffset<NoBit>(allocSize)");
      if (!bVar4) goto LAB_00268891;
      *puVar2 = 0;
    }
    if ((this->trackerDictionary == (TypeInfotoTrackerItemMap *)0x0) &&
       (this->verifyEnabled != true)) {
      if (this->isPageHeapEnabled != allowBumpAllocation) goto LAB_00268867;
    }
    else if (!allowBumpAllocation) goto LAB_0026886d;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x5ac,"(allowBumpAllocation == AllowNativeCodeBumpAllocation())",
                       "allowBumpAllocation == AllowNativeCodeBumpAllocation()");
    if (!bVar4) {
LAB_00268891:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
LAB_00268867:
  if (allowBumpAllocation) {
    return;
  }
LAB_0026886d:
  *freeListOffset = *endAddressOffset;
  return;
}

Assistant:

void Recycler::GetNormalHeapBlockAllocatorInfoForNativeAllocation(size_t allocSize, void*& allocatorAddress, uint32& endAddressOffset, uint32& freeListOffset, bool allowBumpAllocation, bool isOOPJIT)
{
    Assert(HeapInfo::IsAlignedSize(allocSize));
    Assert(HeapInfo::IsSmallObject(allocSize));

    allocatorAddress = (char*)this + offsetof(Recycler, autoHeap)
        + offsetof(HeapInfoManager, defaultHeap)
        + offsetof(HeapInfo, heapBuckets)
        + sizeof(HeapBucketGroup<SmallAllocationBlockAttributes>)*((uint)(allocSize >> HeapConstants::ObjectAllocationShift) - 1)
        + HeapBucketGroup<SmallAllocationBlockAttributes>::GetHeapBucketOffset()
        + HeapBucketT<SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::GetAllocatorHeadOffset();

    endAddressOffset = SmallHeapBlockAllocator<SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::GetEndAddressOffset();
    freeListOffset = SmallHeapBlockAllocator<SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::GetFreeObjectListOffset();;

    if (!isOOPJIT)
    {
        Assert(allocatorAddress == GetAddressOfAllocator<NoBit>(allocSize));
        Assert(endAddressOffset == GetEndAddressOffset<NoBit>(allocSize));
        Assert(freeListOffset == GetFreeObjectListOffset<NoBit>(allocSize));
        Assert(allowBumpAllocation == AllowNativeCodeBumpAllocation());
    }

    if (!allowBumpAllocation)
    {
        freeListOffset = endAddressOffset;
    }
}